

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Vector3f operator*(Matrix3f *m,Vector3f *v)

{
  float fVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  Vector3f *in_RDX;
  Matrix3f *in_RSI;
  Vector3f *in_RDI;
  undefined1 auVar4 [64];
  float fVar5;
  Vector3f VVar6;
  int j;
  int i;
  Vector3f *output;
  undefined4 local_20;
  undefined4 local_1c;
  
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  fVar5 = 0.0;
  Vector3f::Vector3f(in_RDI,0.0,0.0,0.0);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pfVar3 = Matrix3f::operator()(in_RSI,local_1c,local_20);
      fVar5 = *pfVar3;
      pfVar3 = Vector3f::operator[](in_RDX,local_20);
      fVar1 = *pfVar3;
      pfVar3 = Vector3f::operator[](in_RDI,local_1c);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar5),ZEXT416((uint)*pfVar3));
      auVar4 = ZEXT1664(auVar2);
      *pfVar3 = auVar2._0_4_;
    }
  }
  VVar6.m_elements._0_8_ = auVar4._0_8_;
  VVar6.m_elements[2] = fVar5;
  return (Vector3f)VVar6.m_elements;
}

Assistant:

Vector3f operator * ( const Matrix3f& m, const Vector3f& v )
{
	Vector3f output( 0, 0, 0 );

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}